

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  char *pcVar3;
  _Bool _Var4;
  MCOperand *op;
  int64_t iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  
  op = MCInst_getOperand(MI,0);
  _Var4 = MCOperand_isImm(op);
  if (!_Var4) {
    return;
  }
  iVar5 = MCOperand_getImm(op);
  uVar7 = (ulong)MI->flat_insn->size + iVar5 + MI->address;
  if (-1 < (long)uVar7) {
    uVar6 = uVar7 - 0x10000;
    if (MI->csh->mode != CS_MODE_16) {
      uVar6 = uVar7;
    }
    if (0x100000 < uVar7) {
      uVar7 = uVar6;
    }
    if ((long)uVar7 < 10) {
      pcVar3 = " + %lu";
      goto LAB_0014632f;
    }
  }
  pcVar3 = " + 0x%lx";
LAB_0014632f:
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar3 + 3,uVar7);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x3e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    MI->has_imm = true;
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.op_count * 0x30 + 0x46) = uVar7;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;
		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			// handle 16bit segment bound
			if (MI->csh->mode == CS_MODE_16 && imm > 0x100000)
				imm -= 0x10000;

			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}